

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPipeConnection.cxx
# Opt level: O1

void __thiscall cmPipeConnection::Connect(cmPipeConnection *this,uv_stream_t *server)

{
  auto_pipe_t *this_00;
  cmServerBase *pcVar1;
  int iVar2;
  uv_pipe_s *puVar3;
  uv_loop_t *puVar4;
  uv_stream_t *puVar5;
  auto_pipe_t rejectPipe;
  auto_handle_base_<uv_pipe_s> local_28;
  
  this_00 = &this->ClientPipe;
  puVar3 = auto_handle_::operator_cast_to_uv_pipe_s_(&this_00->super_auto_handle_<uv_pipe_s>);
  if (puVar3 != (uv_pipe_s *)0x0) {
    auto_handle_base_<uv_pipe_s>::auto_handle_base_(&local_28);
    local_28._vptr_auto_handle_base_ = (_func_int **)&PTR_allocate_006fa890;
    puVar4 = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
    auto_pipe_t::init((auto_pipe_t *)&local_28,(EVP_PKEY_CTX *)puVar4);
    puVar5 = auto_pipe_t::operator_cast_to_uv_stream_s_((auto_pipe_t *)&local_28);
    uv_accept(server,puVar5);
    auto_handle_base_<uv_pipe_s>::~auto_handle_base_(&local_28);
    return;
  }
  puVar4 = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
  auto_pipe_t::init(this_00,(EVP_PKEY_CTX *)puVar4);
  puVar5 = auto_pipe_t::operator_cast_to_uv_stream_s_(this_00);
  iVar2 = uv_accept(server,puVar5);
  if (iVar2 != 0) {
    auto_handle_base_<uv_pipe_s>::reset((auto_handle_base_<uv_pipe_s> *)this_00);
    return;
  }
  puVar5 = auto_pipe_t::operator_cast_to_uv_stream_s_(this_00);
  (this->super_cmEventBasedConnection).ReadStream = puVar5;
  puVar5 = auto_pipe_t::operator_cast_to_uv_stream_s_(this_00);
  (this->super_cmEventBasedConnection).WriteStream = puVar5;
  uv_read_start((this->super_cmEventBasedConnection).ReadStream,
                cmEventBasedConnection::on_alloc_buffer,cmEventBasedConnection::on_read);
  pcVar1 = (this->super_cmEventBasedConnection).super_cmConnection.Server;
  (*pcVar1->_vptr_cmServerBase[4])(pcVar1,this);
  return;
}

Assistant:

void cmPipeConnection::Connect(uv_stream_t* server)
{
  if ((uv_pipe_t*)this->ClientPipe) {
    // Accept and close all pipes but the first:
    auto_pipe_t rejectPipe;

    rejectPipe.init(*this->Server->GetLoop(), 0);
    uv_accept(server, rejectPipe);

    return;
  }

  this->ClientPipe.init(*this->Server->GetLoop(), 0,
                        static_cast<cmEventBasedConnection*>(this));

  if (uv_accept(server, this->ClientPipe) != 0) {
    this->ClientPipe.reset();
    return;
  }
  this->ReadStream = this->ClientPipe;
  this->WriteStream = this->ClientPipe;

  uv_read_start(this->ReadStream, on_alloc_buffer, on_read);
  Server->OnConnected(this);
}